

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O1

void __thiscall OpenMD::NPTf::scaleSimBox(NPTf *this)

{
  Mat3x3d *pMVar1;
  double *pdVar2;
  double dVar3;
  undefined8 uVar4;
  double dVar5;
  uint i;
  long lVar6;
  Mat3x3d *pMVar7;
  char *__format;
  double *pdVar8;
  Mat3x3d *pMVar9;
  long lVar10;
  double *pdVar11;
  uint k;
  Mat3x3d *pMVar12;
  long lVar13;
  double (*__return_storage_ptr__) [3];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  Mat3x3d scaleMat;
  SquareMatrix3<double> result;
  Mat3x3d hmat;
  double local_f8 [20];
  Mat3x3d local_58;
  
  local_f8[6] = 0.0;
  local_f8[7] = 0.0;
  local_f8[4] = 0.0;
  local_f8[5] = 0.0;
  local_f8[2] = 0.0;
  local_f8[3] = 0.0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  local_f8[8] = 0.0;
  pMVar1 = &this->eta;
  dVar3 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
  dVar14 = 0.0;
  lVar6 = 0;
  dVar15 = 1.0;
  dVar16 = 1.0;
  pMVar7 = pMVar1;
  do {
    lVar10 = 0;
    pMVar9 = pMVar1;
    do {
      dVar17 = 0.0;
      lVar13 = 0;
      pMVar12 = pMVar9;
      do {
        dVar17 = dVar17 + (pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar13] *
                          (pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar13 = lVar13 + 1;
        pMVar12 = (Mat3x3d *)
                  ((pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ +
                  1);
      } while (lVar13 != 3);
      uVar18 = 0x3ff00000;
      if (lVar6 != lVar10) {
        uVar18 = 0;
      }
      local_f8[lVar6 * 3 + lVar10] = (double)((ulong)uVar18 << 0x20);
      dVar17 = (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[lVar6]
               [lVar10] * dVar3 + dVar17 * dVar3 * 0.5 * dVar3 + (double)((ulong)uVar18 << 0x20);
      local_f8[lVar6 * 3 + lVar10] = dVar17;
      if ((lVar6 != lVar10) && (dVar17 = ABS(dVar17), dVar14 < dVar17)) {
        dVar14 = dVar17;
      }
      lVar10 = lVar10 + 1;
      pMVar9 = (Mat3x3d *)
               ((pMVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               1);
    } while (lVar10 != 3);
    dVar17 = local_f8[lVar6 * 4];
    dVar5 = dVar17;
    if (dVar17 <= dVar16) {
      dVar5 = dVar16;
    }
    dVar16 = dVar5;
    if (dVar15 <= dVar17) {
      dVar17 = dVar15;
    }
    dVar15 = dVar17;
    lVar6 = lVar6 + 1;
    pMVar7 = (Mat3x3d *)
             ((pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar6 != 3);
  if ((1.01 < dVar16) || (dVar15 < 0.99)) {
    __format = 
    "NPTf error: Attempting a Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
    ;
  }
  else {
    if (dVar14 <= 0.01) {
      __return_storage_ptr__ = (double (*) [3])&local_58;
      Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,
                        (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
      local_f8[0x10] = 0.0;
      local_f8[0x11] = 0.0;
      local_f8[0xe] = 0.0;
      local_f8[0xf] = 0.0;
      local_f8[0xc] = 0.0;
      local_f8[0xd] = 0.0;
      local_f8[10] = 0.0;
      local_f8[0xb] = 0.0;
      local_f8[0x12] = 0.0;
      lVar6 = 0;
      do {
        lVar10 = 0;
        pdVar8 = local_f8;
        do {
          pdVar2 = local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                   [lVar6 + -4] + lVar10 + 2;
          dVar3 = *pdVar2;
          lVar13 = 0;
          pdVar11 = pdVar8;
          do {
            dVar3 = dVar3 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                            super_RectMatrix<double,_3U,_3U>).data_[0][lVar13] * *pdVar11;
            lVar13 = lVar13 + 1;
            pdVar11 = pdVar11 + 3;
          } while (lVar13 != 3);
          *pdVar2 = dVar3;
          lVar10 = lVar10 + 1;
          pdVar8 = pdVar8 + 1;
        } while (lVar10 != 3);
        lVar6 = lVar6 + 1;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        *(undefined8 *)
         ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
         lVar6 + 0x10) = *(undefined8 *)((long)local_f8 + lVar6 + 0x60);
        uVar4 = *(undefined8 *)((long)local_f8 + lVar6 + 0x58);
        *(undefined8 *)
         ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
         lVar6) = *(undefined8 *)((long)local_f8 + lVar6 + 0x50);
        *(undefined8 *)
         ((long)local_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
         lVar6 + 8) = uVar4;
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x48);
      Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                        &local_58);
      return;
    }
    __format = 
    "NPTf error: Attempting an off-diagonal Box scaling of more than 1 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n      eta = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
    ;
  }
  snprintf(painCave.errMsg,2000,__format,SUB84(local_f8[0],0),local_f8[1],local_f8[2],local_f8[3],
           local_f8[4],local_f8[5],local_f8[6],local_f8[7]);
  painCave.isFatal = 1;
  simError();
  return;
}

Assistant:

void NPTf::scaleSimBox() {
    int i;
    int j;
    int k;
    Mat3x3d scaleMat;
    RealType eta2ij;
    RealType bigScale, smallScale, offDiagMax;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;
    offDiagMax = 0.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        // Calculate the matrix Product of the eta array (we only need
        // the ij element right now):

        eta2ij = 0.0;
        for (k = 0; k < 3; k++) {
          eta2ij += eta(i, k) * eta(k, j);
        }

        scaleMat(i, j) = 0.0;
        // identity matrix (see above):
        if (i == j) scaleMat(i, j) = 1.0;
        // Taylor expansion for the exponential truncated at second order:
        scaleMat(i, j) += dt * eta(i, j) + 0.5 * dt * dt * eta2ij;

        if (i != j)
          if (fabs(scaleMat(i, j)) > offDiagMax)
            offDiagMax = fabs(scaleMat(i, j));
      }

      if (scaleMat(i, i) > bigScale) bigScale = scaleMat(i, i);
      if (scaleMat(i, i) < smallScale) smallScale = scaleMat(i, i);
    }

    if ((bigScale > 1.01) || (smallScale < 0.99)) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NPTf error: Attempting a Box scaling of more than 1 percent.\n"
               " Check your tauBarostat, as it is probably too small!\n\n"
               " scaleMat = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "      eta = [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n"
               "            [%lf\t%lf\t%lf]\n",
               scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
               scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
               scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0),
               eta(1, 1), eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else if (offDiagMax > 0.01) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTf error: Attempting an off-diagonal Box scaling of more than 1 "
          "percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "      eta = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2), eta(0, 0), eta(0, 1), eta(0, 2), eta(1, 0), eta(1, 1),
          eta(1, 2), eta(2, 0), eta(2, 1), eta(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }